

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U>::rehash
          (SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U> *this)

{
  uint uVar1;
  InplaceStr *pIVar2;
  Allocator *pAVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  InplaceStr *pIVar6;
  InplaceStr *item;
  ulong uVar7;
  InplaceStr local_38;
  
  uVar1 = this->bucketCount;
  uVar7 = (ulong)uVar1;
  pIVar2 = this->data;
  this->bucketCount = uVar1 * 2;
  if (this->allocator == (Allocator *)0x0) {
    pIVar6 = (InplaceStr *)(*(code *)NULLC::alloc)(uVar1 << 5);
  }
  else {
    iVar5 = (*this->allocator->_vptr_Allocator[2])();
    pIVar6 = (InplaceStr *)CONCAT44(extraout_var,iVar5);
  }
  this->data = pIVar6;
  NULLC::fillMemory(pIVar6,0,(ulong)this->bucketCount << 4);
  this->count = 0;
  pIVar6 = pIVar2;
  for (; uVar7 != 0; uVar7 = uVar7 - 1) {
    local_38.begin = (char *)0x0;
    local_38.end = (char *)0x0;
    bVar4 = InplaceStr::operator==(pIVar6,&local_38);
    if (!bVar4) {
      insert(this,pIVar6);
    }
    pIVar6 = pIVar6 + 1;
  }
  if (pIVar2 != this->storage) {
    pAVar3 = this->allocator;
    if (pAVar3 == (Allocator *)0x0) {
      (*(code *)NULLC::dealloc)(pIVar2);
    }
    else {
      (*pAVar3->_vptr_Allocator[3])(pAVar3,pIVar2);
    }
  }
  return;
}

Assistant:

void rehash()
	{
		unsigned oldBucketCount = bucketCount;
		Key *oldData = data;

		bucketCount *= 2;

		if(allocator)
			data = (Key*)allocator->alloc(sizeof(Key) * bucketCount);
		else
			data = (Key*)NULLC::alloc(sizeof(Key) * bucketCount);

		NULLC::fillMemory(data, 0, sizeof(Key) * bucketCount);

		count = 0;

		for(unsigned i = 0; i < oldBucketCount; i++)
		{
			Key &item = oldData[i];

			if(item == Key())
				continue;

			insert(item);
		}

		if(oldData != storage)
		{
			if(allocator)
				allocator->dealloc(oldData);
			else
				NULLC::dealloc(oldData);
		}
	}